

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O1

bool ON_RemoveBezierSingAt0(int dim,int order,int cv_stride,double *cv)

{
  int iVar1;
  double dVar2;
  long lVar3;
  int order_00;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  bool bVar10;
  bool bVar11;
  
  lVar3 = (long)dim;
  dVar2 = cv[lVar3];
  bVar10 = (bool)(-(dVar2 != 0.0) & 1);
  order_00 = order;
  if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    uVar4 = (ulong)(order - 1);
    do {
      if (order_00 < 3) {
        return bVar10;
      }
      order_00 = order_00 + -1;
      lVar5 = lVar3;
      while (bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
        if (cv[lVar5] != 0.0) {
          return bVar10;
        }
        if (NAN(cv[lVar5])) {
          return bVar10;
        }
      }
      uVar7 = 0;
      pdVar6 = cv;
      do {
        if (-1 < dim) {
          uVar8 = (ulong)(dim + 1);
          pdVar9 = pdVar6;
          do {
            *pdVar9 = (pdVar9[cv_stride] * (double)order_00) / (double)((int)uVar7 + 1);
            pdVar9 = pdVar9 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        uVar7 = uVar7 + 1;
        pdVar6 = pdVar6 + cv_stride;
      } while (uVar7 != uVar4);
      dVar2 = cv[lVar3];
      bVar10 = (bool)(-(dVar2 != 0.0) & 1);
      uVar4 = uVar4 - 1;
    } while ((dVar2 == 0.0) && (!NAN(dVar2)));
  }
  if (order_00 < order) {
    do {
      iVar1 = order_00 + 1;
      ON_IncreaseBezierDegree(dim,true,order_00,cv_stride,cv);
      order_00 = iVar1;
    } while (order != iVar1);
  }
  return bVar10;
}

Assistant:

bool ON_RemoveBezierSingAt0(
                  int dim, 
                  int order, 
                  int cv_stride,
                  double* cv
                  )
{
  const int cvdim = dim+1;
  int j,k,ord0;
  ord0 = order;
  while(cv[dim] == 0.0) {
    order--; 
    if (order < 2)
      return false;
    j = dim; 
    while(j--) {
      if (cv[j] != 0.0) 
        return false;
    }
    for (j=0;  j<order;  j++) {
      for (k=0;  k<cvdim;  k++) 
        cv[j*cv_stride+k] = (order*cv[(j+1)*cv_stride+k])/(j+1);
    }
  }
  while (order < ord0)
    ON_IncreaseBezierDegree(dim,true,order++,cv_stride,cv);
  return true;
}